

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int server_handle_hello(ptls_t *tls,ptls_message_emitter_t *emitter,ptls_iovec_t message,
                       ptls_handshake_properties_t *properties)

{
  uint *puVar1;
  byte bVar2;
  uint8_t uVar3;
  ushort uVar4;
  en_ptls_state_t eVar5;
  ptls_hpke_cipher_suite_t *ppVar6;
  st_ptls_ech_create_opener_t *psVar7;
  st_ptls_aead_context_t *psVar8;
  uint8_t *puVar9;
  ptls_context_t *ppVar10;
  char *pcVar11;
  ptls_key_exchange_algorithm_t **pppVar12;
  st_ptls_update_traffic_key_t *psVar13;
  ptls_buffer_t *ppVar14;
  ptls_buffer_t *ppVar15;
  undefined8 uVar16;
  undefined8 uVar17;
  undefined8 uVar18;
  ptls_iovec_t pVar19;
  ptls_iovec_t ikm;
  ptls_iovec_t pVar20;
  bool bVar21;
  byte bVar22;
  int iVar23;
  int iVar24;
  int iVar25;
  st_ptls_client_hello_t *ch;
  ptls_aead_context_t *ppVar26;
  size_t sVar27;
  size_t sVar28;
  ptls_key_schedule_t *ppVar29;
  uint8_t *puVar30;
  ulong uVar31;
  ptls_key_exchange_algorithm_t *ppVar32;
  st_ptls_signature_algorithms_t *signature_algorithms;
  long lVar33;
  long lVar34;
  byte bVar35;
  ptls_iovec_t *ppVar36;
  size_t sVar37;
  ptls_hash_context_t **pppVar38;
  size_t sVar39;
  st_ptls_client_hello_t *psVar40;
  uint uVar41;
  size_t sVar42;
  ptls_key_exchange_algorithm_t *ppVar43;
  bool bVar44;
  bool bVar45;
  ptls_iovec_t tbs;
  ptls_iovec_t raw_message;
  ptls_iovec_t raw_message_00;
  ptls_iovec_t ch_trunc;
  ptls_iovec_t message_00;
  ptls_iovec_t message_01;
  int accept_early_data;
  size_t psk_index;
  ptls_iovec_t ecdh_secret;
  anon_struct_24_2_cc7b932a key_share;
  ptls_iovec_t pubkey;
  ptls_cipher_suite_t *cs;
  undefined4 in_stack_fffffffffffff4b8;
  undefined4 in_stack_fffffffffffff4bc;
  ptls_t *tls_cbarg;
  uint8_t *local_b20;
  size_t local_b18;
  size_t local_b08;
  long local_b00;
  uint8_t *local_af8;
  size_t local_ae8;
  size_t local_ae0;
  ulong local_ad8;
  size_t local_ad0;
  uint8_t *local_ac8;
  void *pvStack_ac0;
  ptls_buffer_t local_ab8;
  size_t local_a90;
  int local_a84;
  size_t local_a80;
  ptls_iovec_t local_a78;
  size_t local_a60;
  ptls_key_exchange_algorithm_t *local_a58;
  ptls_iovec_t pStack_a50;
  ptls_iovec_t local_a38;
  char *local_a28;
  undefined8 uStack_a20;
  ptls_on_client_hello_parameters_t local_a18;
  undefined1 local_990 [784];
  undefined1 local_680 [416];
  undefined1 local_4e0 [784];
  undefined1 local_1d0 [416];
  
  local_b20 = (uint8_t *)message.len;
  local_af8 = message.base;
  local_a58 = (ptls_key_exchange_algorithm_t *)0x0;
  pStack_a50.base = (uint8_t *)0x0;
  pStack_a50.len = 0;
  local_ab8.off = 0;
  local_ab8.is_allocated = '\0';
  local_ab8.align_bits = '\0';
  local_ab8._26_6_ = 0;
  local_ab8.capacity = 0;
  local_ac8 = (uint8_t *)0x0;
  pvStack_ac0 = (void *)0x0;
  local_a80 = 0xffffffffffffffff;
  local_a38.base = (uint8_t *)0x0;
  local_a38.len = 0;
  local_a78.base = (uint8_t *)0x0;
  local_a78.len = 0;
  local_a84 = 0;
  eVar5 = tls->state;
  local_ab8.base = "";
  ch = (st_ptls_client_hello_t *)malloc(0x4b0);
  local_ab8.capacity = 0;
  local_ab8.off = 0;
  local_ab8._24_8_ = local_ab8._24_8_ & 0xffffffffffff0000;
  if (ch == (st_ptls_client_hello_t *)0x0) {
    iVar23 = 0x201;
    goto LAB_0011e543;
  }
  memset(local_4e0,0,0x4b0);
  memcpy(local_1d0,&DAT_00128278,0x198);
  memcpy(ch,local_4e0,0x4b0);
  puVar30 = local_af8 + 4;
  iVar23 = decode_client_hello(tls->ctx,ch,puVar30,local_af8 + (long)local_b20,properties,tls);
  if (iVar23 != 0) goto LAB_0011e543;
  psVar40 = (st_ptls_client_hello_t *)0x0;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    psVar40 = (st_ptls_client_hello_t *)tls->client_random;
  }
  raw_message.len = (size_t)tls;
  raw_message.base = local_b20;
  iVar23 = check_client_hello_constraints
                     ((ptls_context_t *)ch,psVar40,(void *)0x0,(int)message.base,raw_message,
                      (ptls_t *)CONCAT44(in_stack_fffffffffffff4bc,in_stack_fffffffffffff4b8));
  if (iVar23 != 0) goto LAB_0011e543;
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if ((tls->ech).aead == (ptls_aead_context_t *)0x0) goto LAB_0011e6b3;
    if ((ch->ech).payload.base != (uint8_t *)0x0) {
      iVar23 = 0x2f;
      if (((((ch->ech).config_id != (tls->ech).config_id) ||
           (ppVar6 = (tls->ech).cipher, (ch->ech).cipher_suite.kdf != (ppVar6->id).kdf)) ||
          ((ch->ech).cipher_suite.aead != (ppVar6->id).aead)) || ((ch->ech).enc.len != 0))
      goto LAB_0011e543;
      goto LAB_0011e6b3;
    }
LAB_0011ee3a:
    iVar23 = 0x6d;
    goto LAB_0011e543;
  }
  puVar9 = ch->random_bytes;
  uVar16 = *(undefined8 *)puVar9;
  uVar17 = *(undefined8 *)(puVar9 + 8);
  uVar18 = *(undefined8 *)(puVar9 + 0x18);
  *(undefined8 *)(tls->client_random + 0x10) = *(undefined8 *)(puVar9 + 0x10);
  *(undefined8 *)(tls->client_random + 0x18) = uVar18;
  *(undefined8 *)tls->client_random = uVar16;
  *(undefined8 *)(tls->client_random + 8) = uVar17;
  log_client_random(tls);
LAB_0011e6b3:
  if ((ch->ech).payload.base == (uint8_t *)0x0) {
    if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x1) !=
        (undefined1  [112])0x0) {
      iVar23 = 0x2f;
      if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
        __assert_fail("is_second_flight",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1162,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      goto LAB_0011e543;
    }
  }
  else {
    iVar23 = 0x2f;
    if ((ch->ech).type != '\0') goto LAB_0011e543;
    if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      *(byte *)&tls->ech = *(byte *)&tls->ech | 1;
      psVar7 = (tls->ctx->ech).server.create_opener;
      if (psVar7 != (st_ptls_ech_create_opener_t *)0x0) {
        local_a28 = "tls ech";
        uStack_a20 = 8;
        pVar19.len = 8;
        pVar19.base = (uint8_t *)"tls ech";
        ppVar26 = (*psVar7->cb)(psVar7,&(tls->ech).kem,&(tls->ech).cipher,tls,(ch->ech).config_id,
                                (ch->ech).cipher_suite,(ch->ech).enc,pVar19);
        (tls->ech).aead = ppVar26;
        if (ppVar26 != (ptls_aead_context_t *)0x0) {
          (tls->ech).config_id = (ch->ech).config_id;
        }
      }
      if (server_handle_hello::logpoint.state.generation != ptls_log._generation) {
        server_handle_hello_cold_1();
      }
      if (server_handle_hello::logpoint.state.active_conns != 0) {
        server_handle_hello_cold_2();
      }
    }
    psVar8 = (tls->ech).aead;
    if (psVar8 != (st_ptls_aead_context_t *)0x0) {
      sVar28 = (ch->ech).payload.len;
      local_ac8 = (uint8_t *)malloc(sVar28 - psVar8->algo->tag_size);
      if (local_ac8 != (uint8_t *)0x0) {
        tls_cbarg = (ptls_t *)(local_b20 + -4);
        pvStack_ac0 = malloc((size_t)tls_cbarg);
        if (pvStack_ac0 != (void *)0x0) {
          local_ad8 = (ulong)(eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO);
          memcpy(pvStack_ac0,puVar30,(size_t)tls_cbarg);
          puVar9 = (ch->ech).payload.base;
          memset((void *)(((long)puVar9 - (long)puVar30) + (long)pvStack_ac0),0,sVar28);
          sVar27 = (*psVar8->do_decrypt)
                             (psVar8,local_ac8,puVar9,sVar28,local_ad8,pvStack_ac0,(size_t)tls_cbarg
                             );
          if (sVar27 == 0xffffffffffffffff) {
            iVar23 = 0x33;
            if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) goto LAB_0011e543;
            psVar8 = (tls->ech).aead;
            (*psVar8->dispose_crypto)(psVar8);
            free(psVar8);
            (tls->ech).aead = (ptls_aead_context_t *)0x0;
          }
          else {
            *(byte *)&tls->ech = *(byte *)&tls->ech | 4;
            iVar23 = rebuild_ch_inner(&local_ab8,local_ac8,
                                      local_ac8 +
                                      ((ch->ech).payload.len - ((tls->ech).aead)->algo->tag_size),ch
                                      ,puVar30 + ch->first_extension_at,local_af8 + (long)local_b20)
            ;
            local_b20 = (uint8_t *)local_ab8.off;
            local_af8 = local_ab8.base;
            if (iVar23 != 0) goto LAB_0011e543;
            memset(local_990,0,0x4b0);
            memcpy(local_680,&DAT_00128278,0x198);
            memcpy(ch,local_990,0x4b0);
            iVar23 = decode_client_hello(tls->ctx,ch,local_af8 + 4,local_af8 + (long)local_b20,
                                         properties,tls);
            if (iVar23 != 0) goto LAB_0011e543;
            puVar30 = (tls->ech).inner_client_random;
            psVar40 = (st_ptls_client_hello_t *)0x0;
            if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
              psVar40 = (st_ptls_client_hello_t *)puVar30;
            }
            raw_message_00.len = (size_t)tls;
            raw_message_00.base = local_b20;
            iVar23 = check_client_hello_constraints
                               ((ptls_context_t *)ch,psVar40,(void *)0x1,(int)local_af8,
                                raw_message_00,tls_cbarg);
            if (iVar23 != 0) goto LAB_0011e543;
            if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
              puVar9 = ch->random_bytes;
              uVar16 = *(undefined8 *)puVar9;
              uVar17 = *(undefined8 *)(puVar9 + 8);
              uVar18 = *(undefined8 *)(puVar9 + 0x18);
              *(undefined8 *)((tls->ech).inner_client_random + 0x10) =
                   *(undefined8 *)(puVar9 + 0x10);
              *(undefined8 *)((tls->ech).inner_client_random + 0x18) = uVar18;
              *(undefined8 *)puVar30 = uVar16;
              *(undefined8 *)((tls->ech).inner_client_random + 8) = uVar17;
            }
          }
          goto LAB_0011e98f;
        }
      }
      iVar23 = 0x201;
      goto LAB_0011e543;
    }
  }
LAB_0011e98f:
  ppVar10 = tls->ctx;
  if ((ppVar10->field_0xb8 & 1) != 0) {
    puVar1 = &(ch->psk).ke_modes;
    *(byte *)puVar1 = (byte)*puVar1 & 0xfe;
  }
  if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    iVar23 = 0x32;
    if (((ch->psk).field_0xb4 & 1) != 0) goto LAB_0011e543;
    pcVar11 = tls->server_name;
    if (pcVar11 != (char *)0x0) {
      sVar28 = strlen(pcVar11);
      if ((ch->server_name).len == sVar28) {
        iVar23 = bcmp((ch->server_name).base,pcVar11,sVar28);
        bVar44 = iVar23 == 0;
        iVar23 = 0x28;
        if (bVar44) {
          iVar23 = 0;
        }
      }
      else {
        iVar23 = 0x28;
        bVar44 = false;
      }
      goto LAB_0011eb78;
    }
  }
  else {
    if ((ch->legacy_session_id).len != 0) {
      tls->field_0x1e8 = tls->field_0x1e8 | 4;
    }
    ppVar32 = (ptls_key_exchange_algorithm_t *)(ch->server_name).base;
    iVar23 = 0;
    if (ppVar32 == (ptls_key_exchange_algorithm_t *)0x0) {
      sVar27 = 0;
      ppVar32 = (ptls_key_exchange_algorithm_t *)0x0;
    }
    else {
      sVar27 = (ch->server_name).len;
    }
    if (ppVar10->on_client_hello != (ptls_on_client_hello_t *)0x0) {
      local_a18.negotiated_protocols.list = (ch->alpn).list;
      local_a18.raw_message.base = local_af8;
      local_a18.raw_message.len = (size_t)local_b20;
      local_a18.cipher_suites.base = (ch->cipher_suites).base;
      local_a18.cipher_suites.len = (ch->cipher_suites).len;
      local_a18.negotiated_protocols.count = (ch->alpn).count;
      local_a18.signature_algorithms.list = (ch->signature_algorithms).list;
      local_a18.signature_algorithms.count = (ch->signature_algorithms).count;
      local_a18.certificate_compression_algorithms.list = (ch->cert_compression_algos).list;
      local_a18.certificate_compression_algorithms.count = (ch->cert_compression_algos).count;
      local_a18.server_certificate_types.count = (ch->server_certificate_types).count;
      local_a18.psk_identities.list = (ch->psk).identities.list;
      local_a18.psk_identities.count = (ch->psk).identities.count;
      local_a18._128_1_ = local_a18._128_1_ & 0xfe;
      local_a18.server_name.base = (uint8_t *)ppVar32;
      local_a18.server_name.len = sVar27;
      local_a18.server_certificate_types.list = (ch->server_certificate_types).list;
      iVar23 = (*ppVar10->on_client_hello->cb)(ppVar10->on_client_hello,tls,&local_a18);
    }
    if (iVar23 == 0) {
      uVar31 = (ch->server_certificate_types).count;
      bVar35 = (byte)tls->ctx->field_0xb8 >> 4 & 2;
      if ((uVar31 == 0) && (bVar35 == 0)) {
        bVar44 = false;
      }
      else {
        bVar44 = uVar31 != 0;
        if ((bVar44) && ((ch->server_certificate_types).list[0] != bVar35)) {
          lVar34 = 0;
          do {
            lVar33 = lVar34;
            if (uVar31 - 1 == lVar33) break;
            lVar34 = lVar33 + 1;
          } while ((ch->server_certificate_types).list[lVar33 + 1] != bVar35);
          bVar44 = lVar33 + 1U < uVar31;
        }
        bVar44 = (bool)(bVar44 ^ 1);
      }
      iVar23 = 0x2b;
      if (!bVar44) {
        iVar23 = 0;
      }
      bVar44 = (bool)(bVar44 ^ 1);
    }
    else {
      bVar44 = false;
    }
LAB_0011eb78:
    if (!bVar44) goto LAB_0011e543;
  }
  ppVar10 = tls->ctx;
  puVar30 = (ch->cipher_suites).base;
  bVar35 = (byte)ppVar10->field_0xb8 >> 7;
  uVar41 = (uint)bVar35;
  iVar23 = select_cipher((ptls_cipher_suite_t **)&local_a18,ppVar10->cipher_suites,puVar30,
                         puVar30 + (ch->cipher_suites).len,(byte)ppVar10->field_0xb8 >> 6 & 1,
                         (uint)bVar35,(ppVar10->pre_shared_key).hash);
  if (iVar23 == 0) {
    if (eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
      if ((ptls_key_exchange_algorithm_t *)tls->cipher_suite ==
          (ptls_key_exchange_algorithm_t *)local_a18.server_name.base) {
LAB_0011ec1b:
        iVar23 = 0;
        bVar44 = true;
      }
      else {
        iVar23 = 0x28;
        bVar44 = false;
      }
    }
    else {
      tls->cipher_suite = (ptls_cipher_suite_t *)local_a18.server_name.base;
      bVar44 = false;
      ppVar29 = key_schedule_new((ptls_cipher_suite_t *)local_a18.server_name.base,
                                 (ptls_cipher_suite_t **)0x0,0);
      tls->key_schedule = ppVar29;
      if (ppVar29 != (ptls_key_schedule_t *)0x0) goto LAB_0011ec1b;
      iVar23 = 0x201;
    }
  }
  else {
    bVar44 = false;
  }
  if (!bVar44) goto LAB_0011e543;
  if (((local_a58 == (ptls_key_exchange_algorithm_t *)0x0) &&
      (ppVar32 = (ptls_key_exchange_algorithm_t *)(ch->key_shares).base,
      ppVar32 != (ptls_key_exchange_algorithm_t *)0x0)) &&
     (pppVar12 = tls->ctx->key_exchanges, pppVar12 != (ptls_key_exchange_algorithm_t **)0x0)) {
    uVar31 = (ch->key_shares).len;
    ppVar43 = (ptls_key_exchange_algorithm_t *)((long)&ppVar32->id + uVar31);
    if (uVar31 < 2) {
      bVar44 = false;
      iVar23 = 0x32;
      local_a18.server_name.base = (uint8_t *)ppVar32;
    }
    else {
      lVar34 = 0;
      uVar31 = 0;
      do {
        uVar31 = (ulong)*(byte *)((long)&ppVar32->id + lVar34) | uVar31 << 8;
        lVar34 = lVar34 + 1;
      } while (lVar34 != 2);
      local_a18.server_name.base = &ppVar32->field_0x2;
      bVar44 = false;
      iVar23 = 0x32;
      if (uVar31 <= (ulong)((long)ppVar43 - (long)local_a18.server_name.base)) {
        ppVar32 = (ptls_key_exchange_algorithm_t *)(local_a18.server_name.base + uVar31);
        iVar24 = select_key_share(&local_a58,&pStack_a50,pppVar12,(uint8_t **)&local_a18,
                                  (uint8_t *)ppVar32,uVar41);
        iVar23 = 0x32;
        if ((ptls_key_exchange_algorithm_t *)local_a18.server_name.base == ppVar32) {
          iVar23 = 0;
        }
        if (iVar24 != 0) {
          iVar23 = iVar24;
        }
        bVar44 = iVar24 == 0 &&
                 (ptls_key_exchange_algorithm_t *)local_a18.server_name.base == ppVar32;
      }
    }
    iVar24 = 0x32;
    if ((ptls_key_exchange_algorithm_t *)local_a18.server_name.base == ppVar43) {
      iVar24 = iVar23;
    }
    if ((!bVar44) ||
       (iVar23 = iVar24, (ptls_key_exchange_algorithm_t *)local_a18.server_name.base != ppVar43))
    goto LAB_0011e543;
  }
  ppVar32 = local_a58;
  local_b00._0_4_ = (uint)(eVar5 == PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO);
  if (eVar5 != PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO) {
    if (local_a58 == (ptls_key_exchange_algorithm_t *)0x0 || (ch->cookie).all.len == 0) {
      if ((((ch->key_shares).base == (uint8_t *)0x0) ||
          (pppVar12 = tls->ctx->key_exchanges, pppVar12 == (ptls_key_exchange_algorithm_t **)0x0))
         || ((local_a58 != (ptls_key_exchange_algorithm_t *)0x0 &&
             ((properties == (ptls_handshake_properties_t *)0x0 ||
              ((*(byte *)((long)&properties->field_0 + 0x60) & 1) == 0)))))) goto LAB_0011ec9a;
      puVar30 = (ch->negotiated_groups).base;
      if (puVar30 == (uint8_t *)0x0) goto LAB_0011ee3a;
      iVar23 = select_negotiated_group
                         ((ptls_key_exchange_algorithm_t **)&local_a18,pppVar12,puVar30,
                          puVar30 + (ch->negotiated_groups).len);
      if (iVar23 != 0) {
        bVar44 = true;
        goto joined_r0x0011fc65;
      }
      ppVar29 = tls->key_schedule;
      if (ppVar29->num_hashes != 0) {
        pppVar38 = &ppVar29->hashes[0].ctx;
        sVar27 = 0;
        do {
          (*(*pppVar38)->update)(*pppVar38,local_af8,(size_t)local_b20);
          sVar27 = sVar27 + 1;
          pppVar38 = pppVar38 + 3;
        } while (sVar27 != ppVar29->num_hashes);
      }
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x11d5,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      if ((properties == (ptls_handshake_properties_t *)0x0) ||
         ((*(byte *)((long)&properties->field_0 + 0x60) & 2) == 0)) {
        bVar45 = false;
      }
      else {
        bVar45 = (undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) ==
                 (undefined1  [112])0x0;
      }
      if (!bVar45) {
        key_schedule_transform_post_ch1hash(tls->key_schedule);
        key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
      }
      iVar23 = (*emitter->begin_message)(emitter);
      if (iVar23 == 0) {
        ppVar14 = emitter->buf;
        iVar23 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
        if (iVar23 == 0) {
          ppVar14->base[ppVar14->off] = '\x02';
          ppVar14->off = ppVar14->off + 1;
          iVar23 = 0;
        }
        if (iVar23 == 0) {
          iVar23 = ptls_buffer_reserve_aligned(ppVar14,3,'\0');
          if (iVar23 == 0) {
            puVar30 = ppVar14->base;
            sVar27 = ppVar14->off;
            puVar30[sVar27 + 2] = '\0';
            puVar30 = puVar30 + sVar27;
            puVar30[0] = '\0';
            puVar30[1] = '\0';
            ppVar14->off = ppVar14->off + 3;
            iVar23 = 0;
          }
          if (iVar23 != 0) goto LAB_0011f99a;
          local_b08 = ppVar14->off;
          ppVar15 = emitter->buf;
          sVar27 = ppVar15->off;
          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
          if (iVar23 == 0) {
            puVar30 = ppVar15->base;
            sVar37 = ppVar15->off;
            (puVar30 + sVar37)[0] = '\x03';
            (puVar30 + sVar37)[1] = '\x03';
            ppVar15->off = ppVar15->off + 2;
            iVar23 = 0;
          }
          local_af8 = (uint8_t *)(sVar27 - 4);
          bVar44 = iVar23 != 0;
          if (iVar23 == 0) {
            sVar27 = 0;
            iVar23 = ptls_buffer_reserve_aligned(emitter->buf,0x20,'\0');
            bVar44 = true;
            if (iVar23 == 0) {
              puVar30 = emitter->buf->base;
              sVar27 = emitter->buf->off;
              puVar9 = puVar30 + sVar27 + 0x10;
              puVar9[0] = 0xc2;
              puVar9[1] = 0xa2;
              puVar9[2] = '\x11';
              puVar9[3] = '\x16';
              puVar9[4] = 'z';
              puVar9[5] = 0xbb;
              puVar9[6] = 0x8c;
              puVar9[7] = '^';
              puVar9[8] = '\a';
              puVar9[9] = 0x9e;
              puVar9[10] = '\t';
              puVar9[0xb] = 0xe2;
              puVar9[0xc] = 200;
              puVar9[0xd] = 0xa8;
              puVar9[0xe] = '3';
              puVar9[0xf] = 0x9c;
              puVar30 = puVar30 + sVar27;
              puVar30[0] = 0xcf;
              puVar30[1] = '!';
              puVar30[2] = 0xad;
              puVar30[3] = 't';
              puVar30[4] = 0xe5;
              puVar30[5] = 0x9a;
              puVar30[6] = 'a';
              puVar30[7] = '\x11';
              puVar30[8] = 0xbe;
              puVar30[9] = '\x1d';
              puVar30[10] = 0x8c;
              puVar30[0xb] = '\x02';
              puVar30[0xc] = '\x1e';
              puVar30[0xd] = 'e';
              puVar30[0xe] = 0xb8;
              puVar30[0xf] = 0x91;
              ppVar15 = emitter->buf;
              ppVar15->off = ppVar15->off + 0x20;
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
              if (iVar23 == 0) {
                ppVar15->base[ppVar15->off] = '\0';
                ppVar15->off = ppVar15->off + 1;
                iVar23 = 0;
              }
              bVar44 = true;
              if (iVar23 == 0) {
                sVar27 = emitter->buf->off;
                iVar23 = ptls_buffer__do_pushv
                                   (emitter->buf,(ch->legacy_session_id).base,
                                    (ch->legacy_session_id).len);
                if (iVar23 != 0) goto LAB_0012050e;
                uVar31 = emitter->buf->off - sVar27;
                iVar23 = 0;
                if (0xff < uVar31) {
                  iVar23 = 0x20c;
                  goto LAB_0012050e;
                }
                emitter->buf->base[sVar27 - 1] = (uint8_t)uVar31;
                bVar21 = true;
                bVar44 = false;
              }
              else {
LAB_0012050e:
                bVar21 = false;
              }
              if (bVar21) {
                uVar4 = tls->cipher_suite->id;
                ppVar15 = emitter->buf;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = iVar23 != 0;
                if (iVar23 == 0) {
                  ppVar15 = emitter->buf;
                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                  if (iVar23 == 0) {
                    ppVar15->base[ppVar15->off] = '\0';
                    ppVar15->off = ppVar15->off + 1;
                    iVar23 = 0;
                  }
                  if (iVar23 == 0) {
                    ppVar15 = emitter->buf;
                    iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                    if (iVar23 == 0) {
                      puVar30 = ppVar15->base;
                      sVar27 = ppVar15->off;
                      (puVar30 + sVar27)[0] = '\0';
                      (puVar30 + sVar27)[1] = '\0';
                      ppVar15->off = ppVar15->off + 2;
                      iVar23 = 0;
                    }
                    if (iVar23 == 0) {
                      ppVar15 = emitter->buf;
                      local_b18 = ppVar15->off;
                      iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                      if (iVar23 == 0) {
                        puVar30 = ppVar15->base;
                        sVar27 = ppVar15->off;
                        (puVar30 + sVar27)[0] = '\0';
                        (puVar30 + sVar27)[1] = '+';
                        ppVar15->off = ppVar15->off + 2;
                        iVar23 = 0;
                      }
                      bVar44 = iVar23 != 0;
                      if (bVar44) goto LAB_00120f5c;
                      ppVar15 = emitter->buf;
                      iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                      if (iVar23 == 0) {
                        puVar30 = ppVar15->base;
                        sVar27 = ppVar15->off;
                        (puVar30 + sVar27)[0] = '\0';
                        (puVar30 + sVar27)[1] = '\0';
                        ppVar15->off = ppVar15->off + 2;
                        iVar23 = 0;
                      }
                      bVar44 = true;
                      if (iVar23 == 0) {
                        ppVar15 = emitter->buf;
                        sVar27 = ppVar15->off;
                        uVar4 = ch->selected_version;
                        iVar24 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                        if (iVar24 == 0) {
                          *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                          ppVar15->off = ppVar15->off + 2;
                          iVar24 = 0;
                        }
                        bVar44 = iVar24 != 0;
                        iVar23 = iVar24;
                        if (iVar24 == 0) {
                          uVar31 = emitter->buf->off - sVar27;
                          iVar23 = 0x20c;
                          bVar44 = true;
                          if (uVar31 < 0x10000) {
                            lVar34 = 8;
                            do {
                              emitter->buf->base[sVar27 - 2] =
                                   (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                              lVar34 = lVar34 + -8;
                              sVar27 = sVar27 + 1;
                            } while (lVar34 != -8);
                            bVar44 = false;
                            iVar23 = iVar24;
                          }
                        }
                      }
                      puVar30 = local_a18.server_name.base;
                      ppVar32 = local_a58;
                      if (bVar44) goto LAB_00120f5c;
                      if ((ptls_key_exchange_algorithm_t *)local_a18.server_name.base ==
                          (ptls_key_exchange_algorithm_t *)0x0 ||
                          local_a58 != (ptls_key_exchange_algorithm_t *)0x0) {
LAB_00120fe7:
                        ppVar15 = emitter->buf;
                        sVar27 = 0;
                        if ((undefined1  [112])
                            ((undefined1  [112])tls->ech & (undefined1  [112])0x4) !=
                            (undefined1  [112])0x0) {
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar9 = ppVar15->base;
                            sVar27 = ppVar15->off;
                            (puVar9 + sVar27)[0] = 0xfe;
                            (puVar9 + sVar27)[1] = '\r';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = iVar23 != 0;
                          if (bVar44) goto LAB_0012118b;
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar9 = ppVar15->base;
                            sVar27 = ppVar15->off;
                            (puVar9 + sVar27)[0] = '\0';
                            (puVar9 + sVar27)[1] = '\0';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = true;
                          if (iVar23 == 0) {
                            sVar37 = ppVar15->off;
                            sVar27 = 0;
                            iVar23 = ptls_buffer_reserve_aligned(ppVar15,8,'\0');
                            if (iVar23 != 0) goto LAB_001221b1;
                            puVar9 = ppVar15->base + ppVar15->off;
                            puVar9[0] = '\0';
                            puVar9[1] = '\0';
                            puVar9[2] = '\0';
                            puVar9[3] = '\0';
                            puVar9[4] = '\0';
                            puVar9[5] = '\0';
                            puVar9[6] = '\0';
                            puVar9[7] = '\0';
                            sVar27 = ppVar15->off;
                            ppVar15->off = sVar27 + 8;
                            uVar31 = (sVar27 + 8) - sVar37;
                            if (0xffff < uVar31) {
                              iVar23 = 0x20c;
                              goto LAB_001221b1;
                            }
                            lVar34 = 8;
                            do {
                              ppVar15->base[sVar37 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f))
                              ;
                              lVar34 = lVar34 + -8;
                              sVar37 = sVar37 + 1;
                            } while (lVar34 != -8);
                            bVar44 = false;
                            bVar21 = true;
                            iVar23 = 0;
                          }
                          else {
                            sVar27 = 0;
LAB_001221b1:
                            bVar21 = false;
                          }
                          if (!bVar21) goto LAB_00122743;
                        }
                        if (bVar45) {
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar9 = ppVar15->base;
                            sVar37 = ppVar15->off;
                            (puVar9 + sVar37)[0] = '\0';
                            (puVar9 + sVar37)[1] = ',';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = iVar23 != 0;
                          if (iVar23 == 0) {
                            iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                            if (iVar23 == 0) {
                              puVar9 = ppVar15->base;
                              sVar37 = ppVar15->off;
                              (puVar9 + sVar37)[0] = '\0';
                              (puVar9 + sVar37)[1] = '\0';
                              ppVar15->off = ppVar15->off + 2;
                              iVar23 = 0;
                            }
                            bVar44 = true;
                            if (iVar23 == 0) {
                              sVar37 = ppVar15->off;
                              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                              if (iVar23 == 0) {
                                puVar9 = ppVar15->base;
                                sVar39 = ppVar15->off;
                                (puVar9 + sVar39)[0] = '\0';
                                (puVar9 + sVar39)[1] = '\0';
                                ppVar15->off = ppVar15->off + 2;
                                iVar23 = 0;
                              }
                              bVar44 = true;
                              if (iVar23 == 0) {
                                local_ae8 = ppVar15->off;
                                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                                if (iVar23 == 0) {
                                  puVar9 = ppVar15->base;
                                  sVar39 = ppVar15->off;
                                  (puVar9 + sVar39)[0] = '\0';
                                  (puVar9 + sVar39)[1] = '\0';
                                  ppVar15->off = ppVar15->off + 2;
                                  iVar23 = 0;
                                }
                                bVar44 = true;
                                if (iVar23 == 0) {
                                  local_ad0 = ppVar15->off;
                                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                                  if (iVar23 == 0) {
                                    ppVar15->base[ppVar15->off] = '\0';
                                    ppVar15->off = ppVar15->off + 1;
                                    iVar23 = 0;
                                  }
                                  bVar44 = true;
                                  if (iVar23 == 0) {
                                    local_a90 = ppVar15->off;
                                    local_a60 = tls->cipher_suite->hash->digest_size;
                                    iVar23 = ptls_buffer_reserve_aligned(ppVar15,local_a60,'\0');
                                    bVar44 = true;
                                    if (iVar23 == 0) {
                                      key_schedule_extract_ch1hash
                                                (tls->key_schedule,ppVar15->base + ppVar15->off);
                                      ppVar15->off = ppVar15->off + local_a60;
                                      uVar31 = ppVar15->off - local_a90;
                                      if (uVar31 < 0x100) {
                                        ppVar15->base[local_a90 - 1] = (uint8_t)uVar31;
                                        bVar44 = false;
                                      }
                                      else {
                                        iVar23 = 0x20c;
                                        bVar44 = true;
                                      }
                                    }
                                  }
                                  if (!bVar44) {
                                    iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                                    if (iVar23 == 0) {
                                      ppVar15->base[ppVar15->off] =
                                           ppVar32 == (ptls_key_exchange_algorithm_t *)0x0;
                                      ppVar15->off = ppVar15->off + 1;
                                      iVar23 = 0;
                                    }
                                    bVar44 = true;
                                    if (iVar23 == 0) {
                                      uVar31 = ppVar15->off - local_ad0;
                                      iVar23 = 0x20c;
                                      if (uVar31 < 0x10000) {
                                        lVar34 = 8;
                                        do {
                                          ppVar15->base[local_ad0 - 2] =
                                               (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                          lVar34 = lVar34 + -8;
                                          local_ad0 = local_ad0 + 1;
                                          bVar44 = false;
                                          iVar23 = 0;
                                        } while (lVar34 != -8);
                                      }
                                    }
                                  }
                                }
                                if (!bVar44) {
                                  sVar39 = ppVar15->off;
                                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                                  if (iVar23 == 0) {
                                    ppVar15->base[ppVar15->off] = '\0';
                                    ppVar15->off = ppVar15->off + 1;
                                    iVar23 = 0;
                                  }
                                  bVar44 = true;
                                  if (iVar23 == 0) {
                                    local_a90 = ppVar15->off;
                                    local_a60 = (*tls->ctx->cipher_suites)->hash->digest_size;
                                    bVar21 = false;
                                    iVar23 = ptls_buffer_reserve_aligned(ppVar15,local_a60,'\0');
                                    bVar44 = true;
                                    if (iVar23 == 0) {
                                      tbs.base = ppVar15->base + local_ae8;
                                      tbs.len = sVar39 - local_ae8;
                                      iVar24 = calc_cookie_signature
                                                         (tls,properties,
                                                          (ptls_key_exchange_algorithm_t *)puVar30,
                                                          tbs,ppVar15->base + ppVar15->off);
                                      iVar23 = 0;
                                      if (iVar24 == 0) {
                                        ppVar15->off = ppVar15->off + local_a60;
                                        bVar21 = true;
                                        bVar44 = false;
                                      }
                                      else {
                                        bVar21 = false;
                                        iVar23 = iVar24;
                                      }
                                    }
                                    if (bVar21) {
                                      uVar31 = ppVar15->off - local_a90;
                                      if (uVar31 < 0x100) {
                                        ppVar15->base[local_a90 - 1] = (uint8_t)uVar31;
                                        bVar44 = false;
                                      }
                                      else {
                                        iVar23 = 0x20c;
                                        bVar44 = true;
                                      }
                                    }
                                  }
                                }
                                if (!bVar44) {
                                  uVar31 = ppVar15->off - local_ae8;
                                  if (uVar31 < 0x10000) {
                                    lVar34 = 8;
                                    do {
                                      ppVar15->base[local_ae8 - 2] =
                                           (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                      lVar34 = lVar34 + -8;
                                      local_ae8 = local_ae8 + 1;
                                    } while (lVar34 != -8);
                                    bVar44 = false;
                                  }
                                  else {
                                    iVar23 = 0x20c;
                                    bVar44 = true;
                                  }
                                }
                              }
                              if (!bVar44) {
                                uVar31 = ppVar15->off - sVar37;
                                if (uVar31 < 0x10000) {
                                  lVar34 = 8;
                                  do {
                                    ppVar15->base[sVar37 - 2] =
                                         (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                    lVar34 = lVar34 + -8;
                                    sVar37 = sVar37 + 1;
                                    bVar44 = false;
                                  } while (lVar34 != -8);
                                }
                                else {
                                  iVar23 = 0x20c;
                                  bVar44 = true;
                                }
                              }
                            }
                          }
                        }
                        else {
                          bVar44 = false;
                        }
                      }
                      else {
                        ppVar15 = emitter->buf;
                        iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                        if (iVar23 == 0) {
                          puVar9 = ppVar15->base;
                          sVar27 = ppVar15->off;
                          (puVar9 + sVar27)[0] = '\0';
                          (puVar9 + sVar27)[1] = '3';
                          ppVar15->off = ppVar15->off + 2;
                          iVar23 = 0;
                        }
                        bVar44 = iVar23 != 0;
                        if (!bVar44) {
                          ppVar15 = emitter->buf;
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar9 = ppVar15->base;
                            sVar27 = ppVar15->off;
                            (puVar9 + sVar27)[0] = '\0';
                            (puVar9 + sVar27)[1] = '\0';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = true;
                          if (iVar23 == 0) {
                            ppVar15 = emitter->buf;
                            sVar27 = ppVar15->off;
                            uVar4 = *(uint16_t *)puVar30;
                            iVar24 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                            if (iVar24 == 0) {
                              *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                              ppVar15->off = ppVar15->off + 2;
                              iVar24 = 0;
                            }
                            bVar44 = iVar24 != 0;
                            iVar23 = iVar24;
                            if (iVar24 == 0) {
                              uVar31 = emitter->buf->off - sVar27;
                              iVar23 = 0x20c;
                              bVar44 = true;
                              if (uVar31 < 0x10000) {
                                lVar34 = 8;
                                do {
                                  emitter->buf->base[sVar27 - 2] =
                                       (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                  lVar34 = lVar34 + -8;
                                  sVar27 = sVar27 + 1;
                                } while (lVar34 != -8);
                                bVar44 = false;
                                iVar23 = iVar24;
                              }
                            }
                          }
                          if (!bVar44) goto LAB_00120fe7;
                        }
LAB_0012118b:
                        sVar27 = 0;
                      }
LAB_00122743:
                      if (!bVar44) {
                        uVar31 = emitter->buf->off - local_b18;
                        if (uVar31 < 0x10000) {
                          lVar34 = 8;
                          do {
                            emitter->buf->base[local_b18 - 2] =
                                 (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                            lVar34 = lVar34 + -8;
                            local_b18 = local_b18 + 1;
                            bVar44 = false;
                          } while (lVar34 != -8);
                        }
                        else {
                          iVar23 = 0x20c;
                          bVar44 = true;
                        }
                      }
                    }
                    else {
                      bVar44 = true;
LAB_00120f5c:
                      sVar27 = 0;
                    }
                    if (!bVar44) {
                      uVar31 = ppVar14->off - local_b08;
                      if (uVar31 < 0x1000000) {
                        lVar34 = 0x10;
                        do {
                          ppVar14->base[local_b08 - 3] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                          lVar34 = lVar34 + -8;
                          local_b08 = local_b08 + 1;
                          bVar44 = false;
                        } while (lVar34 != -8);
                      }
                      else {
                        iVar23 = 0x20c;
                        bVar44 = true;
                      }
                    }
                    goto LAB_0011f99d;
                  }
                  bVar44 = true;
                }
              }
              sVar27 = 0;
            }
          }
          else {
            sVar27 = 0;
          }
        }
        else {
LAB_0011f99a:
          sVar27 = 0;
          bVar44 = true;
        }
LAB_0011f99d:
        if (!bVar44) {
          iVar23 = (*emitter->commit_message)(emitter);
          bVar44 = iVar23 != 0;
        }
      }
      else {
        bVar44 = true;
        sVar27 = 0;
      }
      if (!bVar44) {
        if (sVar27 != 0) {
          puVar30 = emitter->buf->base;
          message_01.base = local_af8 + (long)puVar30;
          message_01.len = emitter->buf->off - (long)local_af8;
          iVar23 = ech_calc_confirmation
                             (tls->key_schedule,puVar30 + sVar27,(tls->ech).inner_client_random,
                              "hrr ech accept confirmation",message_01);
          if (iVar23 != 0) {
            bVar44 = true;
            goto LAB_0011f9c4;
          }
          iVar23 = 0;
        }
        ppVar29 = tls->key_schedule;
        if (ppVar29->num_hashes == 0) {
          bVar44 = false;
        }
        else {
          puVar30 = emitter->buf->base;
          sVar27 = emitter->buf->off;
          pppVar38 = &ppVar29->hashes[0].ctx;
          bVar44 = false;
          sVar37 = 0;
          do {
            (*(*pppVar38)->update)(*pppVar38,local_af8 + (long)puVar30,sVar27 - (long)local_af8);
            sVar37 = sVar37 + 1;
            pppVar38 = pppVar38 + 3;
          } while (sVar37 != ppVar29->num_hashes);
        }
      }
LAB_0011f9c4:
      if (!bVar44) {
        if (bVar45) {
          iVar24 = push_change_cipher_spec(tls,emitter);
          iVar23 = 0x206;
          if (iVar24 != 0) {
            iVar23 = iVar24;
          }
          bVar44 = true;
        }
        else {
          tls->state = PTLS_STATE_SERVER_EXPECT_SECOND_CLIENT_HELLO;
          iVar23 = 0x202;
          bVar44 = true;
          if (((ch->psk).field_0xb4 & 1) != 0) {
            (tls->field_19).server.early_data_skipped_bytes = 0;
          }
        }
      }
    }
    else {
      sVar27 = (*tls->ctx->cipher_suites)->hash->digest_size;
      iVar23 = calc_cookie_signature
                         (tls,properties,local_a58,(ch->cookie).tbs,(uint8_t *)&local_a18);
      if (iVar23 == 0) {
        bVar44 = false;
        if ((ch->cookie).signature.len == sVar27) {
          iVar23 = (*ptls_mem_equal)((ch->cookie).signature.base,&local_a18,sVar27);
          bVar44 = iVar23 != 0;
          iVar23 = 0x28;
          if (bVar44) {
            iVar23 = 0;
          }
        }
        else {
          iVar23 = 0x28;
        }
      }
      else {
        bVar44 = false;
      }
      if (!bVar44) goto LAB_0011e543;
      key_schedule_update_ch1hash_prefix(tls->key_schedule);
      ppVar29 = tls->key_schedule;
      if (ppVar29->num_hashes != 0) {
        puVar30 = (ch->cookie).ch1_hash.base;
        sVar27 = (ch->cookie).ch1_hash.len;
        pppVar38 = &ppVar29->hashes[0].ctx;
        sVar37 = 0;
        do {
          (*(*pppVar38)->update)(*pppVar38,puVar30,sVar27);
          sVar37 = sVar37 + 1;
          pppVar38 = pppVar38 + 3;
        } while (sVar37 != ppVar29->num_hashes);
      }
      key_schedule_extract(tls->key_schedule,(tls->ctx->pre_shared_key).secret);
      sVar27 = emitter->buf->off;
      iVar23 = (*emitter->begin_message)(emitter);
      if (iVar23 == 0) {
        ppVar14 = emitter->buf;
        iVar23 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
        if (iVar23 == 0) {
          ppVar14->base[ppVar14->off] = '\x02';
          ppVar14->off = ppVar14->off + 1;
          iVar23 = 0;
        }
        bVar44 = true;
        if (iVar23 == 0) {
          iVar23 = ptls_buffer_reserve_aligned(ppVar14,3,'\0');
          if (iVar23 == 0) {
            puVar30 = ppVar14->base;
            sVar37 = ppVar14->off;
            puVar30[sVar37 + 2] = '\0';
            puVar30 = puVar30 + sVar37;
            puVar30[0] = '\0';
            puVar30[1] = '\0';
            ppVar14->off = ppVar14->off + 3;
            iVar23 = 0;
          }
          if (iVar23 == 0) {
            sVar37 = ppVar14->off;
            ppVar15 = emitter->buf;
            sVar39 = ppVar15->off;
            iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
            if (iVar23 == 0) {
              puVar30 = ppVar15->base;
              sVar42 = ppVar15->off;
              (puVar30 + sVar42)[0] = '\x03';
              (puVar30 + sVar42)[1] = '\x03';
              ppVar15->off = ppVar15->off + 2;
              iVar23 = 0;
            }
            local_ad8 = sVar39 - 4;
            bVar44 = iVar23 != 0;
            if (bVar44) goto LAB_0011f49d;
            iVar23 = ptls_buffer_reserve_aligned(emitter->buf,0x20,'\0');
            if (iVar23 != 0) goto LAB_0011f47c;
            puVar30 = emitter->buf->base;
            sVar39 = emitter->buf->off;
            puVar9 = puVar30 + sVar39 + 0x10;
            puVar9[0] = 0xc2;
            puVar9[1] = 0xa2;
            puVar9[2] = '\x11';
            puVar9[3] = '\x16';
            puVar9[4] = 'z';
            puVar9[5] = 0xbb;
            puVar9[6] = 0x8c;
            puVar9[7] = '^';
            puVar9[8] = '\a';
            puVar9[9] = 0x9e;
            puVar9[10] = '\t';
            puVar9[0xb] = 0xe2;
            puVar9[0xc] = 200;
            puVar9[0xd] = 0xa8;
            puVar9[0xe] = '3';
            puVar9[0xf] = 0x9c;
            puVar30 = puVar30 + sVar39;
            puVar30[0] = 0xcf;
            puVar30[1] = '!';
            puVar30[2] = 0xad;
            puVar30[3] = 't';
            puVar30[4] = 0xe5;
            puVar30[5] = 0x9a;
            puVar30[6] = 'a';
            puVar30[7] = '\x11';
            puVar30[8] = 0xbe;
            puVar30[9] = '\x1d';
            puVar30[10] = 0x8c;
            puVar30[0xb] = '\x02';
            puVar30[0xc] = '\x1e';
            puVar30[0xd] = 'e';
            puVar30[0xe] = 0xb8;
            puVar30[0xf] = 0x91;
            ppVar15 = emitter->buf;
            ppVar15->off = ppVar15->off + 0x20;
            iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
            if (iVar23 == 0) {
              ppVar15->base[ppVar15->off] = '\0';
              ppVar15->off = ppVar15->off + 1;
              iVar23 = 0;
            }
            bVar44 = true;
            if (iVar23 == 0) {
              sVar39 = emitter->buf->off;
              iVar23 = ptls_buffer__do_pushv
                                 (emitter->buf,(ch->legacy_session_id).base,
                                  (ch->legacy_session_id).len);
              if (iVar23 != 0) goto LAB_0011fba5;
              uVar31 = emitter->buf->off - sVar39;
              iVar23 = 0;
              if (0xff < uVar31) {
                iVar23 = 0x20c;
                goto LAB_0011fba5;
              }
              emitter->buf->base[sVar39 - 1] = (uint8_t)uVar31;
              bVar45 = true;
              bVar44 = false;
            }
            else {
LAB_0011fba5:
              bVar45 = false;
            }
            if (bVar45) {
              uVar4 = tls->cipher_suite->id;
              ppVar15 = emitter->buf;
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              bVar44 = iVar23 != 0;
              if (iVar23 == 0) {
                ppVar15 = emitter->buf;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                if (iVar23 == 0) {
                  ppVar15->base[ppVar15->off] = '\0';
                  ppVar15->off = ppVar15->off + 1;
                  iVar23 = 0;
                }
                if (iVar23 != 0) goto LAB_0011f47c;
                ppVar15 = emitter->buf;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = '\0';
                  (puVar30 + sVar39)[1] = '\0';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = true;
                if (iVar23 == 0) {
                  ppVar15 = emitter->buf;
                  sVar39 = ppVar15->off;
                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                  if (iVar23 == 0) {
                    puVar30 = ppVar15->base;
                    sVar42 = ppVar15->off;
                    (puVar30 + sVar42)[0] = '\0';
                    (puVar30 + sVar42)[1] = '+';
                    ppVar15->off = ppVar15->off + 2;
                    iVar23 = 0;
                  }
                  bVar44 = iVar23 != 0;
                  if (iVar23 == 0) {
                    ppVar15 = emitter->buf;
                    iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                    if (iVar23 == 0) {
                      puVar30 = ppVar15->base;
                      sVar42 = ppVar15->off;
                      (puVar30 + sVar42)[0] = '\0';
                      (puVar30 + sVar42)[1] = '\0';
                      ppVar15->off = ppVar15->off + 2;
                      iVar23 = 0;
                    }
                    bVar44 = true;
                    if (iVar23 == 0) {
                      ppVar15 = emitter->buf;
                      sVar42 = ppVar15->off;
                      uVar4 = ch->selected_version;
                      iVar24 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                      if (iVar24 == 0) {
                        *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                        ppVar15->off = ppVar15->off + 2;
                        iVar24 = 0;
                      }
                      bVar44 = iVar24 != 0;
                      iVar23 = iVar24;
                      if (iVar24 == 0) {
                        uVar31 = emitter->buf->off - sVar42;
                        iVar23 = 0x20c;
                        bVar44 = true;
                        if (uVar31 < 0x10000) {
                          lVar34 = 8;
                          do {
                            emitter->buf->base[sVar42 - 2] =
                                 (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                            lVar34 = lVar34 + -8;
                            sVar42 = sVar42 + 1;
                          } while (lVar34 != -8);
                          bVar44 = false;
                          iVar23 = iVar24;
                        }
                      }
                    }
                    if (!bVar44) {
                      if (((ch->cookie).field_0x40 & 1) == 0) {
LAB_0012091c:
                        ppVar15 = emitter->buf;
                        iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                        if (iVar23 == 0) {
                          puVar30 = ppVar15->base;
                          sVar42 = ppVar15->off;
                          (puVar30 + sVar42)[0] = '\0';
                          (puVar30 + sVar42)[1] = ',';
                          ppVar15->off = ppVar15->off + 2;
                          iVar23 = 0;
                        }
                        bVar44 = iVar23 != 0;
                        if (!bVar44) {
                          ppVar15 = emitter->buf;
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar30 = ppVar15->base;
                            sVar42 = ppVar15->off;
                            (puVar30 + sVar42)[0] = '\0';
                            (puVar30 + sVar42)[1] = '\0';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = true;
                          if (iVar23 == 0) {
                            sVar42 = emitter->buf->off;
                            iVar23 = ptls_buffer__do_pushv
                                               (emitter->buf,(ch->cookie).all.base,
                                                (ch->cookie).all.len);
                            if (iVar23 == 0) {
                              uVar31 = emitter->buf->off - sVar42;
                              iVar23 = 0x20c;
                              if (uVar31 < 0x10000) {
                                lVar34 = 8;
                                do {
                                  emitter->buf->base[sVar42 - 2] =
                                       (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                  lVar34 = lVar34 + -8;
                                  sVar42 = sVar42 + 1;
                                  bVar44 = false;
                                  iVar23 = 0;
                                } while (lVar34 != -8);
                              }
                            }
                          }
                        }
                      }
                      else {
                        ppVar15 = emitter->buf;
                        iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                        if (iVar23 == 0) {
                          puVar30 = ppVar15->base;
                          sVar42 = ppVar15->off;
                          (puVar30 + sVar42)[0] = '\0';
                          (puVar30 + sVar42)[1] = '3';
                          ppVar15->off = ppVar15->off + 2;
                          iVar23 = 0;
                        }
                        bVar44 = iVar23 != 0;
                        if (!bVar44) {
                          ppVar15 = emitter->buf;
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar30 = ppVar15->base;
                            sVar42 = ppVar15->off;
                            (puVar30 + sVar42)[0] = '\0';
                            (puVar30 + sVar42)[1] = '\0';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = true;
                          if (iVar23 == 0) {
                            ppVar15 = emitter->buf;
                            sVar42 = ppVar15->off;
                            uVar4 = ppVar32->id;
                            iVar24 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                            if (iVar24 == 0) {
                              *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                              ppVar15->off = ppVar15->off + 2;
                              iVar24 = 0;
                            }
                            bVar44 = iVar24 != 0;
                            iVar23 = iVar24;
                            if (iVar24 == 0) {
                              uVar31 = emitter->buf->off - sVar42;
                              iVar23 = 0x20c;
                              bVar44 = true;
                              if (uVar31 < 0x10000) {
                                lVar34 = 8;
                                do {
                                  emitter->buf->base[sVar42 - 2] =
                                       (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                  lVar34 = lVar34 + -8;
                                  sVar42 = sVar42 + 1;
                                } while (lVar34 != -8);
                                bVar44 = false;
                                iVar23 = iVar24;
                              }
                            }
                          }
                          if (!bVar44) goto LAB_0012091c;
                        }
                      }
                      if (!bVar44) {
                        uVar31 = emitter->buf->off - sVar39;
                        if (uVar31 < 0x10000) {
                          lVar34 = 8;
                          do {
                            emitter->buf->base[sVar39 - 2] =
                                 (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                            lVar34 = lVar34 + -8;
                            sVar39 = sVar39 + 1;
                            bVar44 = false;
                          } while (lVar34 != -8);
                        }
                        else {
                          iVar23 = 0x20c;
                          bVar44 = true;
                        }
                      }
                    }
                  }
                }
                if (!bVar44) {
                  uVar31 = ppVar14->off - sVar37;
                  if (uVar31 < 0x1000000) {
                    lVar34 = 0x10;
                    do {
                      ppVar14->base[sVar37 - 3] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                      lVar34 = lVar34 + -8;
                      sVar37 = sVar37 + 1;
                    } while (lVar34 != -8);
                    bVar44 = false;
                  }
                  else {
                    iVar23 = 0x20c;
                    bVar44 = true;
                  }
                }
              }
            }
          }
          else {
LAB_0011f47c:
            bVar44 = true;
          }
        }
LAB_0011f49d:
        if (!bVar44) {
          iVar23 = (*emitter->commit_message)(emitter);
          bVar44 = iVar23 != 0;
        }
      }
      else {
        bVar44 = true;
      }
      if (!bVar44) {
        ppVar29 = tls->key_schedule;
        if (ppVar29->num_hashes == 0) {
          bVar44 = false;
        }
        else {
          puVar30 = emitter->buf->base;
          sVar37 = emitter->buf->off;
          pppVar38 = &ppVar29->hashes[0].ctx;
          sVar39 = 0;
          do {
            (*(*pppVar38)->update)(*pppVar38,puVar30 + local_ad8,sVar37 - local_ad8);
            sVar39 = sVar39 + 1;
            pppVar38 = pppVar38 + 3;
          } while (sVar39 != ppVar29->num_hashes);
          bVar44 = false;
        }
      }
      if (!bVar44) {
        emitter->buf->off = sVar27;
        local_b00._0_4_ = 1;
        bVar44 = false;
      }
      if (!bVar44) goto LAB_0011ec9a;
    }
joined_r0x0011fc65:
    if (!bVar44) {
      return iVar23;
    }
    goto LAB_0011e543;
  }
LAB_0011ec9a:
  iVar23 = report_unknown_extensions(tls,properties,ch->unknown_extensions);
  if ((iVar23 != 0) ||
     ((((puVar30 = (ch->psk).hash_end, puVar30 != (uint8_t *)0x0 && (((ch->psk).ke_modes & 3) != 0))
       && (ppVar10 = tls->ctx, (ppVar10->field_0xb8 & 8) == 0)) &&
      (((((uint)local_b00 == 0 && (ppVar10->encrypt_ticket != (ptls_encrypt_ticket_t *)0x0)) ||
        ((ppVar10->pre_shared_key).identity.base != (uint8_t *)0x0)) &&
       (ch_trunc.len = (long)puVar30 - (long)local_af8, ch_trunc.base = local_af8,
       iVar23 = try_psk_handshake(tls,&local_a80,&local_a84,ch,ch_trunc,(uint)local_b00),
       iVar23 != 0)))))) goto LAB_0011e543;
  sVar27 = local_a80;
  iVar23 = 0x73;
  if ((tls->ctx->pre_shared_key).identity.base != (uint8_t *)0x0 && local_a80 == 0xffffffffffffffff)
  goto LAB_0011e543;
  if ((local_a80 == 0xffffffffffffffff) || ((tls->ctx->field_0xb8 & 8) != 0)) {
    ppVar29 = tls->key_schedule;
    if (ppVar29->num_hashes != 0) {
      pppVar38 = &ppVar29->hashes[0].ctx;
      sVar27 = 0;
      do {
        (*(*pppVar38)->update)(*pppVar38,local_af8,(size_t)local_b20);
        sVar27 = sVar27 + 1;
        pppVar38 = pppVar38 + 3;
      } while (sVar27 != ppVar29->num_hashes);
    }
    if ((uint)local_b00 == 0) {
      if (tls->key_schedule->generation != 0) {
        __assert_fail("tls->key_schedule->generation == 0",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x1243,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      key_schedule_extract(tls->key_schedule,(ptls_iovec_t)ZEXT816(0));
    }
    iVar24 = 0;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      ppVar36 = (ptls_iovec_t *)0x0;
      iVar24 = 0;
      goto LAB_0011f256;
    }
  }
  else {
    ppVar29 = tls->key_schedule;
    if (ppVar29->num_hashes != 0) {
      puVar30 = (ch->psk).hash_end;
      pppVar38 = &ppVar29->hashes[0].ctx;
      sVar37 = 0;
      do {
        (*(*pppVar38)->update)
                  (*pppVar38,puVar30,(long)(local_af8 + (long)local_b20) - (long)puVar30);
        sVar37 = sVar37 + 1;
        pppVar38 = pppVar38 + 3;
      } while (sVar37 != ppVar29->num_hashes);
    }
    uVar41 = (ch->psk).ke_modes;
    iVar24 = 1;
    if (((uVar41 & 1) == 0) && (iVar24 = 2, (uVar41 & 2) == 0)) {
      __assert_fail("(ch->psk.ke_modes & (1u << PTLS_PSK_KE_MODE_PSK_DHE)) != 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                    0x124e,
                    "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                   );
    }
    tls->field_0x1e8 = tls->field_0x1e8 | 2;
    if (properties != (ptls_handshake_properties_t *)0x0) {
      ppVar36 = (ptls_iovec_t *)(ch->psk).identities.list[sVar27].binder.len;
      memcpy(properties,(ch->psk).identities.list[sVar27].binder.base,(size_t)ppVar36);
LAB_0011f256:
      (properties->field_0).client.ech.retry_configs = ppVar36;
    }
  }
  if (((ch->psk).ke_modes == 0) || (ppVar10 = tls->ctx, ppVar10->ticket_lifetime == 0)) {
    (tls->field_19).server.num_tickets_to_send = '\0';
  }
  else {
    bVar35 = (ch->ticket_request).new_session_count;
    if (bVar35 == 0) {
      bVar35 = 1;
    }
    else if ((tls->field_0x1e8 & 2) != 0) {
      bVar35 = (ch->ticket_request).resumption_count;
    }
    (tls->field_19).server.num_tickets_to_send = bVar35;
    bVar2 = (ppVar10->ticket_requests).server.max_count;
    bVar22 = 4;
    if (bVar2 != 0) {
      bVar22 = bVar2;
    }
    if (bVar22 < bVar35) {
      (tls->field_19).server.num_tickets_to_send = bVar22;
    }
  }
  if (((local_a84 != 0) && (tls->ctx->max_early_data_size != 0)) && (local_a80 == 0)) {
    puVar30 = (uint8_t *)malloc(0x40);
    tls->pending_handshake_secret = puVar30;
    iVar23 = 0x201;
    if (((puVar30 == (uint8_t *)0x0) || (iVar23 = derive_exporter_secret(tls,1), iVar23 != 0)) ||
       (iVar23 = setup_traffic_protection(tls,0,"c e traffic",1,0,0), iVar23 != 0))
    goto LAB_0011e543;
  }
  ppVar32 = local_a58;
  if (iVar24 != 1) {
    if (local_a58 == (st_ptls_key_exchange_algorithm_t *)0x0) {
      iVar23 = 0x28;
      if ((ch->key_shares).base == (uint8_t *)0x0) {
        iVar23 = 0x6d;
      }
      goto LAB_0011e543;
    }
    pVar20.len = pStack_a50.len;
    pVar20.base = pStack_a50.base;
    iVar23 = (*local_a58->exchange)(local_a58,&local_a38,&local_a78,pVar20);
    if (iVar23 != 0) {
      if (local_a38.base != (uint8_t *)0x0) {
        __assert_fail("pubkey.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x127c,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      if (local_a78.base != (uint8_t *)0x0) {
        __assert_fail("ecdh_secret.base == NULL",
                      "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c"
                      ,0x127d,
                      "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                     );
      }
      goto LAB_0011e543;
    }
    tls->key_share = ppVar32;
  }
  iVar23 = (*emitter->begin_message)(emitter);
  if (iVar23 == 0) {
    ppVar14 = emitter->buf;
    iVar23 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
    if (iVar23 == 0) {
      ppVar14->base[ppVar14->off] = '\x02';
      ppVar14->off = ppVar14->off + 1;
      iVar23 = 0;
    }
    bVar44 = true;
    if (iVar23 == 0) {
      iVar23 = ptls_buffer_reserve_aligned(ppVar14,3,'\0');
      if (iVar23 == 0) {
        puVar30 = ppVar14->base;
        sVar27 = ppVar14->off;
        puVar30[sVar27 + 2] = '\0';
        puVar30 = puVar30 + sVar27;
        puVar30[0] = '\0';
        puVar30[1] = '\0';
        ppVar14->off = ppVar14->off + 3;
        iVar23 = 0;
      }
      if (iVar23 != 0) goto LAB_0011f646;
      sVar27 = ppVar14->off;
      ppVar15 = emitter->buf;
      sVar37 = ppVar15->off;
      iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
      if (iVar23 == 0) {
        puVar30 = ppVar15->base;
        sVar39 = ppVar15->off;
        (puVar30 + sVar39)[0] = '\x03';
        (puVar30 + sVar39)[1] = '\x03';
        ppVar15->off = ppVar15->off + 2;
        iVar23 = 0;
      }
      local_b00 = sVar37 - 4;
      if (iVar23 == 0) {
        lVar34 = 0;
        iVar23 = ptls_buffer_reserve_aligned(emitter->buf,0x20,'\0');
        if (iVar23 == 0) {
          (*tls->ctx->random_bytes)(emitter->buf->base + emitter->buf->off,0x20);
          if ((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x4) ==
              (undefined1  [112])0x0) {
            lVar34 = 0;
          }
          else {
            sVar37 = emitter->buf->off;
            puVar30 = emitter->buf->base + sVar37 + 0x18;
            puVar30[0] = '\0';
            puVar30[1] = '\0';
            puVar30[2] = '\0';
            puVar30[3] = '\0';
            puVar30[4] = '\0';
            puVar30[5] = '\0';
            puVar30[6] = '\0';
            puVar30[7] = '\0';
            lVar34 = sVar37 + 0x18;
          }
          ppVar15 = emitter->buf;
          ppVar15->off = ppVar15->off + 0x20;
          iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
          if (iVar23 == 0) {
            ppVar15->base[ppVar15->off] = '\0';
            ppVar15->off = ppVar15->off + 1;
            iVar23 = 0;
          }
          bVar44 = true;
          if (iVar23 == 0) {
            sVar37 = emitter->buf->off;
            iVar23 = ptls_buffer__do_pushv
                               (emitter->buf,(ch->legacy_session_id).base,
                                (ch->legacy_session_id).len);
            if (iVar23 != 0) goto LAB_00120168;
            uVar31 = emitter->buf->off - sVar37;
            iVar23 = 0;
            if (0xff < uVar31) {
              iVar23 = 0x20c;
              goto LAB_00120168;
            }
            emitter->buf->base[sVar37 - 1] = (uint8_t)uVar31;
            bVar45 = true;
            bVar44 = false;
          }
          else {
LAB_00120168:
            bVar45 = false;
          }
          if (bVar45) {
            uVar4 = tls->cipher_suite->id;
            ppVar15 = emitter->buf;
            iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
            if (iVar23 == 0) {
              *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
              ppVar15->off = ppVar15->off + 2;
              iVar23 = 0;
            }
            bVar44 = iVar23 != 0;
            if (iVar23 == 0) {
              ppVar15 = emitter->buf;
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
              if (iVar23 == 0) {
                ppVar15->base[ppVar15->off] = '\0';
                ppVar15->off = ppVar15->off + 1;
                iVar23 = 0;
              }
              bVar44 = true;
              if (iVar23 == 0) {
                ppVar15 = emitter->buf;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar37 = ppVar15->off;
                  (puVar30 + sVar37)[0] = '\0';
                  (puVar30 + sVar37)[1] = '\0';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = true;
                if (iVar23 == 0) {
                  ppVar15 = emitter->buf;
                  local_b08 = ppVar15->off;
                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                  if (iVar23 == 0) {
                    puVar30 = ppVar15->base;
                    sVar37 = ppVar15->off;
                    (puVar30 + sVar37)[0] = '\0';
                    (puVar30 + sVar37)[1] = '+';
                    ppVar15->off = ppVar15->off + 2;
                    iVar23 = 0;
                  }
                  bVar44 = iVar23 != 0;
                  if (iVar23 == 0) {
                    ppVar15 = emitter->buf;
                    iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                    if (iVar23 == 0) {
                      puVar30 = ppVar15->base;
                      sVar37 = ppVar15->off;
                      (puVar30 + sVar37)[0] = '\0';
                      (puVar30 + sVar37)[1] = '\0';
                      ppVar15->off = ppVar15->off + 2;
                      iVar23 = 0;
                    }
                    bVar44 = true;
                    if (iVar23 == 0) {
                      ppVar15 = emitter->buf;
                      sVar37 = ppVar15->off;
                      uVar4 = ch->selected_version;
                      iVar25 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                      if (iVar25 == 0) {
                        *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                        ppVar15->off = ppVar15->off + 2;
                        iVar25 = 0;
                      }
                      bVar44 = iVar25 != 0;
                      iVar23 = iVar25;
                      if (iVar25 == 0) {
                        uVar31 = emitter->buf->off - sVar37;
                        iVar23 = 0x20c;
                        bVar44 = true;
                        if (uVar31 < 0x10000) {
                          lVar33 = 8;
                          do {
                            emitter->buf->base[sVar37 - 2] =
                                 (uint8_t)(uVar31 >> ((byte)lVar33 & 0x3f));
                            lVar33 = lVar33 + -8;
                            sVar37 = sVar37 + 1;
                          } while (lVar33 != -8);
                          bVar44 = false;
                          iVar23 = iVar25;
                        }
                      }
                    }
                    if (!bVar44) {
                      ppVar15 = emitter->buf;
                      if (iVar24 == 1) {
LAB_00120d57:
                        if (iVar24 == 0) {
                          bVar44 = false;
                        }
                        else {
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar30 = ppVar15->base;
                            sVar37 = ppVar15->off;
                            (puVar30 + sVar37)[0] = '\0';
                            (puVar30 + sVar37)[1] = ')';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = iVar23 != 0;
                          if (!bVar44) {
                            iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                            sVar37 = local_a80;
                            if (iVar23 == 0) {
                              puVar30 = ppVar15->base;
                              sVar39 = ppVar15->off;
                              (puVar30 + sVar39)[0] = '\0';
                              (puVar30 + sVar39)[1] = '\0';
                              ppVar15->off = ppVar15->off + 2;
                              iVar23 = 0;
                            }
                            bVar44 = true;
                            if (iVar23 == 0) {
                              sVar39 = ppVar15->off;
                              iVar25 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                              if (iVar25 == 0) {
                                *(ushort *)(ppVar15->base + ppVar15->off) =
                                     (ushort)sVar37 << 8 | (ushort)sVar37 >> 8;
                                ppVar15->off = ppVar15->off + 2;
                                iVar25 = 0;
                              }
                              bVar44 = iVar25 != 0;
                              iVar23 = iVar25;
                              if (iVar25 == 0) {
                                uVar31 = ppVar15->off - sVar39;
                                iVar23 = 0x20c;
                                bVar44 = true;
                                if (uVar31 < 0x10000) {
                                  lVar33 = 8;
                                  do {
                                    ppVar15->base[sVar39 - 2] =
                                         (uint8_t)(uVar31 >> ((byte)lVar33 & 0x3f));
                                    lVar33 = lVar33 + -8;
                                    sVar39 = sVar39 + 1;
                                    bVar44 = false;
                                    iVar23 = iVar25;
                                  } while (lVar33 != -8);
                                }
                              }
                            }
                          }
                        }
                      }
                      else {
                        iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                        if (iVar23 == 0) {
                          puVar30 = ppVar15->base;
                          sVar37 = ppVar15->off;
                          (puVar30 + sVar37)[0] = '\0';
                          (puVar30 + sVar37)[1] = '3';
                          ppVar15->off = ppVar15->off + 2;
                          iVar23 = 0;
                        }
                        bVar44 = iVar23 != 0;
                        if (iVar23 == 0) {
                          iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                          if (iVar23 == 0) {
                            puVar30 = ppVar15->base;
                            sVar37 = ppVar15->off;
                            (puVar30 + sVar37)[0] = '\0';
                            (puVar30 + sVar37)[1] = '\0';
                            ppVar15->off = ppVar15->off + 2;
                            iVar23 = 0;
                          }
                          bVar44 = true;
                          if (iVar23 == 0) {
                            sVar37 = ppVar15->off;
                            uVar4 = local_a58->id;
                            iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                            if (iVar23 == 0) {
                              *(ushort *)(ppVar15->base + ppVar15->off) = uVar4 << 8 | uVar4 >> 8;
                              ppVar15->off = ppVar15->off + 2;
                              iVar23 = 0;
                            }
                            bVar44 = iVar23 != 0;
                            if (iVar23 == 0) {
                              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                              if (iVar23 == 0) {
                                puVar30 = ppVar15->base;
                                sVar39 = ppVar15->off;
                                (puVar30 + sVar39)[0] = '\0';
                                (puVar30 + sVar39)[1] = '\0';
                                ppVar15->off = ppVar15->off + 2;
                                iVar23 = 0;
                              }
                              bVar44 = true;
                              if (iVar23 == 0) {
                                local_b18 = ppVar15->off;
                                iVar23 = ptls_buffer__do_pushv(ppVar15,local_a38.base,local_a38.len)
                                ;
                                if (iVar23 != 0) goto LAB_00122081;
                                uVar31 = ppVar15->off - local_b18;
                                if (0xffff < uVar31) {
                                  iVar23 = 0x20c;
                                  goto LAB_00122081;
                                }
                                lVar33 = 8;
                                do {
                                  ppVar15->base[local_b18 - 2] =
                                       (uint8_t)(uVar31 >> ((byte)lVar33 & 0x3f));
                                  lVar33 = lVar33 + -8;
                                  local_b18 = local_b18 + 1;
                                } while (lVar33 != -8);
                                bVar44 = false;
                                bVar45 = true;
                                iVar23 = 0;
                              }
                              else {
LAB_00122081:
                                bVar45 = false;
                              }
                              if (bVar45) {
                                uVar31 = ppVar15->off - sVar37;
                                if (uVar31 < 0x10000) {
                                  lVar33 = 8;
                                  do {
                                    ppVar15->base[sVar37 - 2] =
                                         (uint8_t)(uVar31 >> ((byte)lVar33 & 0x3f));
                                    lVar33 = lVar33 + -8;
                                    sVar37 = sVar37 + 1;
                                  } while (lVar33 != -8);
                                  bVar44 = false;
                                }
                                else {
                                  iVar23 = 0x20c;
                                  bVar44 = true;
                                }
                              }
                            }
                          }
                          if (!bVar44) goto LAB_00120d57;
                        }
                      }
                      if (!bVar44) {
                        uVar31 = emitter->buf->off - local_b08;
                        if (uVar31 < 0x10000) {
                          lVar33 = 8;
                          do {
                            emitter->buf->base[local_b08 - 2] =
                                 (uint8_t)(uVar31 >> ((byte)lVar33 & 0x3f));
                            lVar33 = lVar33 + -8;
                            local_b08 = local_b08 + 1;
                            bVar44 = false;
                          } while (lVar33 != -8);
                        }
                        else {
                          iVar23 = 0x20c;
                          bVar44 = true;
                        }
                      }
                    }
                  }
                }
                if (!bVar44) {
                  uVar31 = ppVar14->off - sVar27;
                  if (uVar31 < 0x1000000) {
                    lVar33 = 0x10;
                    do {
                      ppVar14->base[sVar27 - 3] = (uint8_t)(uVar31 >> ((byte)lVar33 & 0x3f));
                      lVar33 = lVar33 + -8;
                      sVar27 = sVar27 + 1;
                      bVar44 = false;
                    } while (lVar33 != -8);
                  }
                  else {
                    iVar23 = 0x20c;
                    bVar44 = true;
                  }
                }
              }
            }
          }
        }
      }
      else {
        lVar34 = 0;
        bVar44 = iVar23 != 0;
      }
    }
    else {
LAB_0011f646:
      lVar34 = 0;
    }
    if (!bVar44) {
      iVar23 = (*emitter->commit_message)(emitter);
      bVar44 = iVar23 != 0;
    }
  }
  else {
    bVar44 = true;
    lVar34 = 0;
  }
  if (!bVar44) {
    if (lVar34 != 0) {
      puVar30 = emitter->buf->base;
      message_00.base = puVar30 + local_b00;
      message_00.len = emitter->buf->off - local_b00;
      iVar23 = ech_calc_confirmation
                         (tls->key_schedule,puVar30 + lVar34,(tls->ech).inner_client_random,
                          "ech accept confirmation",message_00);
      if (iVar23 != 0) {
        bVar44 = true;
        goto LAB_0011f67b;
      }
      iVar23 = 0;
    }
    ppVar29 = tls->key_schedule;
    if (ppVar29->num_hashes == 0) {
      bVar44 = false;
    }
    else {
      puVar30 = emitter->buf->base;
      sVar27 = emitter->buf->off;
      pppVar38 = &ppVar29->hashes[0].ctx;
      sVar37 = 0;
      do {
        (*(*pppVar38)->update)(*pppVar38,puVar30 + local_b00,sVar27 - local_b00);
        sVar37 = sVar37 + 1;
        pppVar38 = pppVar38 + 3;
      } while (sVar37 != ppVar29->num_hashes);
      bVar44 = false;
    }
  }
LAB_0011f67b:
  if (bVar44) goto LAB_0011e543;
  if (bVar44) {
    return iVar23;
  }
  clear_ech(&tls->ech,1);
  iVar23 = push_change_cipher_spec(tls,emitter);
  if (iVar23 != 0) goto LAB_0011e543;
  if (tls->key_schedule->generation != 1) {
    __assert_fail("tls->key_schedule->generation == 1",
                  "/workspace/llm4binary/github/license_c_cmakelists/h2o[P]picotls/lib/picotls.c",
                  0x12ad,
                  "int server_handle_hello(ptls_t *, ptls_message_emitter_t *, ptls_iovec_t, ptls_handshake_properties_t *)"
                 );
  }
  ikm.len = local_a78.len;
  ikm.base = local_a78.base;
  key_schedule_extract(tls->key_schedule,ikm);
  iVar23 = setup_traffic_protection(tls,1,"s hs traffic",2,0,0);
  if (iVar23 != 0) goto LAB_0011e543;
  if (tls->pending_handshake_secret == (uint8_t *)0x0) {
    iVar23 = setup_traffic_protection(tls,0,"c hs traffic",2,0,0);
    if (iVar23 != 0) goto LAB_0011e543;
    if (((ch->psk).field_0xb4 & 1) != 0) {
      (tls->field_19).server.early_data_skipped_bytes = 0;
    }
  }
  else {
    iVar23 = derive_secret(tls->key_schedule,tls->pending_handshake_secret,"c hs traffic");
    if ((iVar23 != 0) ||
       ((psVar13 = tls->ctx->update_traffic_key, psVar13 != (st_ptls_update_traffic_key_t *)0x0 &&
        (iVar23 = (*psVar13->cb)(psVar13,tls,0,2,tls->pending_handshake_secret), iVar23 != 0))))
    goto LAB_0011e543;
  }
  iVar23 = (*emitter->begin_message)(emitter);
  if (iVar23 == 0) {
    ppVar14 = emitter->buf;
    ppVar29 = tls->key_schedule;
    sVar27 = ppVar14->off;
    iVar23 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
    if (iVar23 == 0) {
      ppVar14->base[ppVar14->off] = '\b';
      ppVar14->off = ppVar14->off + 1;
      iVar23 = 0;
    }
    bVar44 = true;
    if (iVar23 == 0) {
      iVar23 = ptls_buffer_reserve_aligned(ppVar14,3,'\0');
      if (iVar23 == 0) {
        puVar30 = ppVar14->base;
        sVar37 = ppVar14->off;
        puVar30[sVar37 + 2] = '\0';
        puVar30 = puVar30 + sVar37;
        puVar30[0] = '\0';
        puVar30[1] = '\0';
        ppVar14->off = ppVar14->off + 3;
        iVar23 = 0;
      }
      bVar44 = true;
      if (iVar23 == 0) {
        sVar37 = ppVar14->off;
        ppVar15 = emitter->buf;
        iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
        if (iVar23 == 0) {
          puVar30 = ppVar15->base;
          sVar39 = ppVar15->off;
          (puVar30 + sVar39)[0] = '\0';
          (puVar30 + sVar39)[1] = '\0';
          ppVar15->off = ppVar15->off + 2;
          iVar23 = 0;
        }
        if (iVar23 == 0) {
          local_af8 = (uint8_t *)ppVar15->off;
          if (tls->server_name == (char *)0x0) {
LAB_00120377:
            if ((tls->ctx->field_0xb8 & 0x20) != 0) {
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '\x14';
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              bVar44 = iVar23 != 0;
              if (bVar44) goto LAB_00121672;
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '\0';
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              bVar44 = true;
              if (iVar23 == 0) {
                sVar39 = ppVar15->off;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                if (iVar23 == 0) {
                  ppVar15->base[ppVar15->off] = '\x02';
                  ppVar15->off = ppVar15->off + 1;
                  iVar23 = 0;
                }
                if (iVar23 != 0) goto LAB_00120840;
                uVar31 = ppVar15->off - sVar39;
                if (0xffff < uVar31) {
                  iVar23 = 0x20c;
                  goto LAB_00120840;
                }
                lVar34 = 8;
                do {
                  ppVar15->base[sVar39 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                  lVar34 = lVar34 + -8;
                  sVar39 = sVar39 + 1;
                } while (lVar34 != -8);
                bVar44 = false;
                bVar45 = true;
                iVar23 = 0;
              }
              else {
LAB_00120840:
                bVar45 = false;
              }
              if (!bVar45) goto LAB_00121672;
            }
            if (tls->negotiated_protocol != (char *)0x0) {
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '\x10';
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              bVar44 = iVar23 != 0;
              if (bVar44) goto LAB_00121672;
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '\0';
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              bVar44 = true;
              if (iVar23 == 0) {
                sVar39 = ppVar15->off;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar42 = ppVar15->off;
                  (puVar30 + sVar42)[0] = '\0';
                  (puVar30 + sVar42)[1] = '\0';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = true;
                if (iVar23 == 0) {
                  local_ad8 = ppVar15->off;
                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                  if (iVar23 == 0) {
                    ppVar15->base[ppVar15->off] = '\0';
                    ppVar15->off = ppVar15->off + 1;
                    iVar23 = 0;
                  }
                  bVar44 = true;
                  if (iVar23 == 0) {
                    sVar42 = ppVar15->off;
                    pcVar11 = tls->negotiated_protocol;
                    sVar28 = strlen(pcVar11);
                    iVar23 = ptls_buffer__do_pushv(ppVar15,pcVar11,sVar28);
                    if (iVar23 != 0) goto LAB_0012156e;
                    uVar31 = ppVar15->off - sVar42;
                    iVar23 = 0;
                    if (0xff < uVar31) {
                      iVar23 = 0x20c;
                      goto LAB_0012156e;
                    }
                    ppVar15->base[sVar42 - 1] = (uint8_t)uVar31;
                    bVar45 = true;
                    bVar44 = false;
                  }
                  else {
LAB_0012156e:
                    bVar45 = false;
                  }
                  if (bVar45) {
                    uVar31 = ppVar15->off - local_ad8;
                    if (uVar31 < 0x10000) {
                      lVar34 = 8;
                      do {
                        ppVar15->base[local_ad8 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                        lVar34 = lVar34 + -8;
                        local_ad8 = local_ad8 + 1;
                      } while (lVar34 != -8);
                      bVar44 = false;
                    }
                    else {
                      iVar23 = 0x20c;
                      bVar44 = true;
                    }
                  }
                }
                if (!bVar44) {
                  uVar31 = ppVar15->off - sVar39;
                  if (uVar31 < 0x10000) {
                    lVar34 = 8;
                    do {
                      ppVar15->base[sVar39 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                      lVar34 = lVar34 + -8;
                      sVar39 = sVar39 + 1;
                    } while (lVar34 != -8);
                    bVar44 = false;
                  }
                  else {
                    iVar23 = 0x20c;
                    bVar44 = true;
                  }
                }
              }
              if (bVar44) goto LAB_00121672;
            }
            if (tls->pending_handshake_secret == (uint8_t *)0x0) {
LAB_001219e8:
              if ((((undefined1  [112])((undefined1  [112])tls->ech & (undefined1  [112])0x5) ==
                    (undefined1  [112])0x1) &&
                  ((tls->ctx->ech).server.create_opener != (ptls_ech_create_opener_t *)0x0)) &&
                 ((tls->ctx->ech).server.retry_configs.len != 0)) {
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = 0xfe;
                  (puVar30 + sVar39)[1] = '\r';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = iVar23 != 0;
                if (bVar44) goto LAB_00121672;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = '\0';
                  (puVar30 + sVar39)[1] = '\0';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = true;
                if (iVar23 == 0) {
                  sVar39 = ppVar15->off;
                  iVar23 = ptls_buffer__do_pushv
                                     (ppVar15,(tls->ctx->ech).server.retry_configs.base,
                                      (tls->ctx->ech).server.retry_configs.len);
                  if (iVar23 != 0) goto LAB_00121e8c;
                  uVar31 = ppVar15->off - sVar39;
                  if (0xffff < uVar31) {
                    iVar23 = 0x20c;
                    goto LAB_00121e8c;
                  }
                  lVar34 = 8;
                  do {
                    ppVar15->base[sVar39 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                    lVar34 = lVar34 + -8;
                    sVar39 = sVar39 + 1;
                  } while (lVar34 != -8);
                  bVar44 = false;
                  bVar45 = true;
                  iVar23 = 0;
                }
                else {
LAB_00121e8c:
                  bVar45 = false;
                }
                if (!bVar45) goto LAB_00121672;
              }
              if (((ch->ticket_request).new_session_count != '\0') &&
                 ((tls->field_19).server.num_tickets_to_send != '\0')) {
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = '\0';
                  (puVar30 + sVar39)[1] = ':';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = iVar23 != 0;
                if (bVar44) goto LAB_00121672;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = '\0';
                  (puVar30 + sVar39)[1] = '\0';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = true;
                if (iVar23 == 0) {
                  sVar39 = ppVar15->off;
                  uVar3 = (tls->field_19).server.num_tickets_to_send;
                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
                  if (iVar23 == 0) {
                    ppVar15->base[ppVar15->off] = uVar3;
                    ppVar15->off = ppVar15->off + 1;
                    iVar23 = 0;
                  }
                  if (iVar23 != 0) goto LAB_00121f93;
                  uVar31 = ppVar15->off - sVar39;
                  if (0xffff < uVar31) {
                    iVar23 = 0x20c;
                    goto LAB_00121f93;
                  }
                  lVar34 = 8;
                  do {
                    ppVar15->base[sVar39 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                    lVar34 = lVar34 + -8;
                    sVar39 = sVar39 + 1;
                  } while (lVar34 != -8);
                  bVar44 = false;
                  bVar45 = true;
                  iVar23 = 0;
                }
                else {
LAB_00121f93:
                  bVar45 = false;
                }
                if (!bVar45) goto LAB_00121672;
              }
              iVar23 = push_additional_extensions(properties,ppVar15);
              if (iVar23 != 0) goto LAB_0011fee9;
              uVar31 = ppVar15->off - (long)local_af8;
              iVar23 = 0x20c;
              bVar44 = true;
              if (uVar31 < 0x10000) {
                lVar34 = 8;
                do {
                  ppVar15->base[(long)local_af8 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                  lVar34 = lVar34 + -8;
                  local_af8 = (uint8_t *)((long)local_af8 + 1);
                  bVar44 = false;
                  iVar23 = 0;
                } while (lVar34 != -8);
              }
            }
            else {
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '*';
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              bVar44 = iVar23 != 0;
              if (!bVar44) {
                iVar25 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar25 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = '\0';
                  (puVar30 + sVar39)[1] = '\0';
                  ppVar15->off = ppVar15->off + 2;
                  iVar25 = 0;
                }
                bVar44 = true;
                iVar23 = iVar25;
                if (iVar25 == 0) {
                  sVar39 = ppVar15->off;
                  lVar34 = -2;
                  do {
                    ppVar15->base[lVar34 + sVar39] = '\0';
                    lVar34 = lVar34 + 1;
                  } while (lVar34 != 0);
                  bVar44 = false;
                  iVar23 = 0;
                }
                if (iVar25 == 0) goto LAB_001219e8;
              }
            }
          }
          else {
            iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
            if (iVar23 == 0) {
              puVar30 = ppVar15->base;
              sVar39 = ppVar15->off;
              (puVar30 + sVar39)[0] = '\0';
              (puVar30 + sVar39)[1] = '\0';
              ppVar15->off = ppVar15->off + 2;
              iVar23 = 0;
            }
            bVar44 = iVar23 != 0;
            if (!bVar44) {
              iVar25 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar25 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '\0';
                ppVar15->off = ppVar15->off + 2;
                iVar25 = 0;
              }
              bVar44 = true;
              iVar23 = iVar25;
              if (iVar25 == 0) {
                sVar39 = ppVar15->off;
                lVar34 = -2;
                do {
                  ppVar15->base[lVar34 + sVar39] = '\0';
                  lVar34 = lVar34 + 1;
                } while (lVar34 != 0);
                bVar44 = false;
                iVar23 = 0;
              }
              if (iVar25 == 0) goto LAB_00120377;
            }
          }
        }
        else {
LAB_0011fee9:
          bVar44 = true;
        }
LAB_00121672:
        if (!bVar44) {
          uVar31 = ppVar14->off - sVar37;
          if (uVar31 < 0x1000000) {
            lVar34 = 0x10;
            do {
              ppVar14->base[sVar37 - 3] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
              lVar34 = lVar34 + -8;
              sVar37 = sVar37 + 1;
            } while (lVar34 != -8);
            bVar44 = false;
          }
          else {
            iVar23 = 0x20c;
            bVar44 = true;
          }
        }
      }
      if (((!bVar44) && (bVar44 = false, ppVar29 != (ptls_key_schedule_t *)0x0)) &&
         (ppVar29->num_hashes != 0)) {
        puVar30 = ppVar14->base;
        sVar37 = ppVar14->off;
        pppVar38 = &ppVar29->hashes[0].ctx;
        bVar44 = false;
        sVar39 = 0;
        do {
          (*(*pppVar38)->update)(*pppVar38,puVar30 + sVar27,sVar37 - sVar27);
          sVar39 = sVar39 + 1;
          pppVar38 = pppVar38 + 3;
        } while (sVar39 != ppVar29->num_hashes);
      }
    }
    if (!bVar44) {
      iVar23 = (*emitter->commit_message)(emitter);
      bVar44 = iVar23 != 0;
    }
  }
  else {
    bVar44 = true;
  }
  if (bVar44) goto LAB_0011e543;
  if (bVar44) {
    return iVar23;
  }
  if (iVar24 == 0) {
    if ((tls->ctx->field_0xb8 & 8) != 0) {
      iVar23 = (*emitter->begin_message)(emitter);
      if (iVar23 == 0) {
        ppVar14 = emitter->buf;
        ppVar29 = tls->key_schedule;
        sVar27 = ppVar14->off;
        iVar23 = ptls_buffer_reserve_aligned(ppVar14,1,'\0');
        if (iVar23 == 0) {
          ppVar14->base[ppVar14->off] = '\r';
          ppVar14->off = ppVar14->off + 1;
          iVar23 = 0;
        }
        local_ad8._0_4_ = 2;
        if (iVar23 == 0) {
          iVar23 = ptls_buffer_reserve_aligned(ppVar14,3,'\0');
          if (iVar23 == 0) {
            puVar30 = ppVar14->base;
            sVar37 = ppVar14->off;
            puVar30[sVar37 + 2] = '\0';
            puVar30 = puVar30 + sVar37;
            puVar30[0] = '\0';
            puVar30[1] = '\0';
            ppVar14->off = ppVar14->off + 3;
            iVar23 = 0;
          }
          local_ad8._0_4_ = 2;
          if (iVar23 == 0) {
            sVar37 = ppVar14->off;
            ppVar15 = emitter->buf;
            iVar23 = ptls_buffer_reserve_aligned(ppVar15,1,'\0');
            if (iVar23 == 0) {
              ppVar15->base[ppVar15->off] = '\0';
              ppVar15->off = ppVar15->off + 1;
              iVar23 = 0;
            }
            local_ad8._0_4_ = 2;
            if (iVar23 == 0) {
              iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
              if (iVar23 == 0) {
                puVar30 = ppVar15->base;
                sVar39 = ppVar15->off;
                (puVar30 + sVar39)[0] = '\0';
                (puVar30 + sVar39)[1] = '\0';
                ppVar15->off = ppVar15->off + 2;
                iVar23 = 0;
              }
              if (iVar23 == 0) {
                local_b08 = ppVar15->off;
                iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                if (iVar23 == 0) {
                  puVar30 = ppVar15->base;
                  sVar39 = ppVar15->off;
                  (puVar30 + sVar39)[0] = '\0';
                  (puVar30 + sVar39)[1] = '\r';
                  ppVar15->off = ppVar15->off + 2;
                  iVar23 = 0;
                }
                bVar44 = iVar23 != 0;
                if (iVar23 == 0) {
                  iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                  if (iVar23 == 0) {
                    puVar30 = ppVar15->base;
                    sVar39 = ppVar15->off;
                    (puVar30 + sVar39)[0] = '\0';
                    (puVar30 + sVar39)[1] = '\0';
                    ppVar15->off = ppVar15->off + 2;
                    iVar23 = 0;
                  }
                  local_ad8._0_4_ = 2;
                  if (iVar23 == 0) {
                    sVar39 = ppVar15->off;
                    iVar23 = push_signature_algorithms(tls->ctx->verify_certificate,ppVar15);
                    if (iVar23 != 0) goto LAB_00121b41;
                    uVar31 = ppVar15->off - sVar39;
                    if (0xffff < uVar31) {
                      iVar23 = 0x20c;
                      goto LAB_00121b41;
                    }
                    lVar34 = 8;
                    do {
                      ppVar15->base[sVar39 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                      lVar34 = lVar34 + -8;
                      sVar39 = sVar39 + 1;
                    } while (lVar34 != -8);
                    local_ad8._0_4_ = 0;
                    bVar44 = true;
                    iVar23 = 0;
                  }
                  else {
LAB_00121b41:
                    bVar44 = false;
                  }
                  if (bVar44) {
                    if ((tls->ctx->client_ca_names).count != 0) {
                      iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                      if (iVar23 == 0) {
                        puVar30 = ppVar15->base;
                        sVar39 = ppVar15->off;
                        (puVar30 + sVar39)[0] = '\0';
                        (puVar30 + sVar39)[1] = '/';
                        ppVar15->off = ppVar15->off + 2;
                        iVar23 = 0;
                      }
                      bVar44 = iVar23 != 0;
                      if (bVar44) goto LAB_00121972;
                      iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                      if (iVar23 == 0) {
                        puVar30 = ppVar15->base;
                        sVar39 = ppVar15->off;
                        (puVar30 + sVar39)[0] = '\0';
                        (puVar30 + sVar39)[1] = '\0';
                        ppVar15->off = ppVar15->off + 2;
                        iVar23 = 0;
                      }
                      local_ad8._0_4_ = 2;
                      if (iVar23 == 0) {
                        sVar39 = ppVar15->off;
                        iVar23 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                        if (iVar23 == 0) {
                          puVar30 = ppVar15->base;
                          sVar42 = ppVar15->off;
                          (puVar30 + sVar42)[0] = '\0';
                          (puVar30 + sVar42)[1] = '\0';
                          ppVar15->off = ppVar15->off + 2;
                          iVar23 = 0;
                        }
                        local_ad8._0_4_ = 2;
                        if (iVar23 == 0) {
                          local_af8 = (uint8_t *)ppVar15->off;
                          local_ad8._0_4_ = 0x264;
                          if ((tls->ctx->client_ca_names).count == 0) {
                            iVar24 = 0;
                            iVar23 = (int)local_ad8;
                          }
                          else {
                            local_ae0 = 0;
                            do {
                              iVar24 = ptls_buffer_reserve_aligned(ppVar15,2,'\0');
                              if (iVar24 == 0) {
                                puVar30 = ppVar15->base;
                                sVar42 = ppVar15->off;
                                (puVar30 + sVar42)[0] = '\0';
                                (puVar30 + sVar42)[1] = '\0';
                                ppVar15->off = ppVar15->off + 2;
                                iVar24 = 0;
                              }
                              iVar23 = 2;
                              if (iVar24 == 0) {
                                sVar42 = ppVar15->off;
                                ppVar36 = (tls->ctx->client_ca_names).list;
                                iVar25 = ptls_buffer__do_pushv
                                                   (ppVar15,ppVar36[local_ae0].base,
                                                    ppVar36[local_ae0].len);
                                if (iVar25 == 0) {
                                  uVar31 = ppVar15->off - sVar42;
                                  iVar24 = 0x20c;
                                  if (uVar31 < 0x10000) {
                                    lVar34 = 8;
                                    do {
                                      ppVar15->base[sVar42 - 2] =
                                           (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                      lVar34 = lVar34 + -8;
                                      sVar42 = sVar42 + 1;
                                    } while (lVar34 != -8);
                                    iVar23 = 0;
                                    iVar24 = iVar25;
                                  }
                                }
                                else {
                                  iVar23 = (uint)(iVar25 != 0) * 2;
                                  iVar24 = iVar25;
                                }
                              }
                            } while ((iVar23 == 0) &&
                                    (local_ae0 = local_ae0 + 1, iVar23 = (int)local_ad8,
                                    local_ae0 != (tls->ctx->client_ca_names).count));
                          }
                          local_ad8._0_4_ = iVar23;
                          iVar23 = iVar24;
                          if ((int)local_ad8 == 0x264) {
                            uVar31 = ppVar15->off - (long)local_af8;
                            local_ad8._0_4_ = 2;
                            iVar23 = 0x20c;
                            if (uVar31 < 0x10000) {
                              lVar34 = 8;
                              do {
                                ppVar15->base[(long)local_af8 - 2] =
                                     (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                                lVar34 = lVar34 + -8;
                                local_af8 = (uint8_t *)((long)local_af8 + 1);
                              } while (lVar34 != -8);
                              local_ad8._0_4_ = 0;
                              iVar23 = iVar24;
                            }
                          }
                        }
                        if ((int)local_ad8 == 0) {
                          uVar31 = ppVar15->off - sVar39;
                          if (uVar31 < 0x10000) {
                            lVar34 = 8;
                            do {
                              ppVar15->base[sVar39 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f))
                              ;
                              lVar34 = lVar34 + -8;
                              sVar39 = sVar39 + 1;
                            } while (lVar34 != -8);
                            local_ad8._0_4_ = 0;
                          }
                          else {
                            iVar23 = 0x20c;
                            local_ad8._0_4_ = 2;
                          }
                        }
                      }
                      if ((int)local_ad8 != 0) goto LAB_00122377;
                    }
                    uVar31 = ppVar15->off - local_b08;
                    if (uVar31 < 0x10000) {
                      lVar34 = 8;
                      do {
                        ppVar15->base[local_b08 - 2] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                        lVar34 = lVar34 + -8;
                        local_b08 = local_b08 + 1;
                        local_ad8._0_4_ = 0;
                      } while (lVar34 != -8);
                    }
                    else {
                      iVar23 = 0x20c;
                      local_ad8._0_4_ = 2;
                    }
                  }
                }
                else {
LAB_00121972:
                  local_ad8._0_4_ = (uint)bVar44 * 2;
                }
              }
            }
LAB_00122377:
            if ((int)local_ad8 == 0) {
              uVar31 = ppVar14->off - sVar37;
              if (uVar31 < 0x1000000) {
                lVar34 = 0x10;
                do {
                  ppVar14->base[sVar37 - 3] = (uint8_t)(uVar31 >> ((byte)lVar34 & 0x3f));
                  lVar34 = lVar34 + -8;
                  sVar37 = sVar37 + 1;
                } while (lVar34 != -8);
                local_ad8._0_4_ = 0;
              }
              else {
                iVar23 = 0x20c;
                local_ad8._0_4_ = 2;
              }
            }
          }
          if ((((int)local_ad8 == 0) && (local_ad8._0_4_ = 0, ppVar29 != (ptls_key_schedule_t *)0x0)
              ) && (ppVar29->num_hashes != 0)) {
            puVar30 = ppVar14->base;
            sVar37 = ppVar14->off;
            pppVar38 = &ppVar29->hashes[0].ctx;
            local_ad8._0_4_ = 0;
            sVar39 = 0;
            do {
              (*(*pppVar38)->update)(*pppVar38,puVar30 + sVar27,sVar37 - sVar27);
              sVar39 = sVar39 + 1;
              pppVar38 = pppVar38 + 3;
            } while (sVar39 != ppVar29->num_hashes);
          }
        }
        if ((int)local_ad8 == 0) {
          iVar23 = (*emitter->commit_message)(emitter);
          local_ad8._0_4_ = (uint)(iVar23 != 0) * 2;
        }
      }
      else {
        local_ad8._0_4_ = 2;
      }
      if ((int)local_ad8 == 2) goto LAB_0011e543;
      if ((int)local_ad8 != 0) {
        return iVar23;
      }
      if (iVar23 != 0) goto LAB_0011e543;
    }
    signature_algorithms = &ch->signature_algorithms;
    iVar23 = send_certificate(tls,emitter,signature_algorithms,(ptls_iovec_t)ZEXT816(0),
                              (byte)ch->field_0x228 & 1,(ch->cert_compression_algos).list,
                              (ch->cert_compression_algos).count);
    if (iVar23 != 0) goto LAB_0011e543;
    iVar23 = 1;
  }
  else {
    iVar23 = 0;
    signature_algorithms = (st_ptls_signature_algorithms_t *)0x0;
  }
  iVar23 = server_finish_handshake(tls,emitter,iVar23,signature_algorithms);
LAB_0011e543:
  free(local_a38.base);
  if (local_a78.base != (uint8_t *)0x0) {
    (*ptls_clear_memory)(local_a78.base,local_a78.len);
    free(local_a78.base);
  }
  free(local_ac8);
  free(pvStack_ac0);
  puVar30 = local_ab8.base;
  (*ptls_clear_memory)(local_ab8.base,local_ab8.off);
  if (local_ab8.is_allocated != '\0') {
    free(puVar30);
  }
  local_ab8.off = 0;
  local_ab8.is_allocated = '\0';
  local_ab8.align_bits = '\0';
  local_ab8._26_6_ = 0;
  local_ab8.base = (uint8_t *)0x0;
  local_ab8.capacity = 0;
  free(ch);
  return iVar23;
}

Assistant:

static int server_handle_hello(ptls_t *tls, ptls_message_emitter_t *emitter, ptls_iovec_t message,
                               ptls_handshake_properties_t *properties)
{
#define EMIT_SERVER_HELLO(sched, fill_rand, extensions, post_action)                                                               \
    do {                                                                                                                           \
        size_t sh_start_off;                                                                                                       \
        ptls_push_message(emitter, NULL, PTLS_HANDSHAKE_TYPE_SERVER_HELLO, {                                                       \
            sh_start_off = emitter->buf->off - PTLS_HANDSHAKE_HEADER_SIZE;                                                         \
            ptls_buffer_push16(emitter->buf, 0x0303 /* legacy version */);                                                         \
            if ((ret = ptls_buffer_reserve(emitter->buf, PTLS_HELLO_RANDOM_SIZE)) != 0)                                            \
                goto Exit;                                                                                                         \
            do {                                                                                                                   \
                fill_rand                                                                                                          \
            } while (0);                                                                                                           \
            emitter->buf->off += PTLS_HELLO_RANDOM_SIZE;                                                                           \
            ptls_buffer_push_block(emitter->buf, 1,                                                                                \
                                   { ptls_buffer_pushv(emitter->buf, ch->legacy_session_id.base, ch->legacy_session_id.len); });   \
            ptls_buffer_push16(emitter->buf, tls->cipher_suite->id);                                                               \
            ptls_buffer_push(emitter->buf, 0);                                                                                     \
            ptls_buffer_push_block(emitter->buf, 2, {                                                                              \
                buffer_push_extension(emitter->buf, PTLS_EXTENSION_TYPE_SUPPORTED_VERSIONS,                                        \
                                      { ptls_buffer_push16(emitter->buf, ch->selected_version); });                                \
                do {                                                                                                               \
                    extensions                                                                                                     \
                } while (0);                                                                                                       \
            });                                                                                                                    \
        }